

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O0

void __thiscall
CombinedH264Demuxer::getTrackList
          (CombinedH264Demuxer *this,
          map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
          *trackList)

{
  mapped_type *pmVar1;
  TrackInfo local_88;
  TrackInfo local_48;
  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_> *local_18;
  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
  *trackList_local;
  CombinedH264Demuxer *this_local;
  
  local_18 = trackList;
  trackList_local =
       (map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_> *)
       this;
  TrackInfo::TrackInfo(&local_48,0xe,"",0);
  pmVar1 = std::
           map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
           operator[](local_18,&MVC_STREAM_INDEX);
  TrackInfo::operator=(pmVar1,&local_48);
  TrackInfo::~TrackInfo(&local_48);
  TrackInfo::TrackInfo(&local_88,1,"",0);
  pmVar1 = std::
           map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
           operator[](local_18,&AVC_STREAM_INDEX);
  TrackInfo::operator=(pmVar1,&local_88);
  TrackInfo::~TrackInfo(&local_88);
  return;
}

Assistant:

void CombinedH264Demuxer::getTrackList(std::map<int32_t, TrackInfo>& trackList)
{
    trackList[MVC_STREAM_INDEX] = TrackInfo(CODEC_V_MPEG4_H264_DEP, "", 0);
    trackList[AVC_STREAM_INDEX] = TrackInfo(CODEC_V_MPEG4_H264, "", 0);
}